

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O3

void __thiscall mocker::ir::Malloc::~Malloc(Malloc *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Malloc_001eaa10;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Malloc_001eaa30;
  p_Var1 = (this->size).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Definition_001e8c98;
  p_Var1 = (this->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

Malloc(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> size)
      : IRInst(InstType::Malloc), Definition(std::move(dest)),
        size(std::move(size)) {}